

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::write_build_config_to_sym_file(CTcMake *this,CVmFile *fp)

{
  textchar_t *ptVar1;
  CVmFile *this_00;
  CVmFile *in_RSI;
  long in_RDI;
  char buf [32];
  size_t cnt;
  CTcTokFileDesc *desc;
  CTcMakePath *inc;
  CTcMakeDef *def;
  uint in_stack_ffffffffffffff3c;
  CVmFile *in_stack_ffffffffffffff40;
  CVmFile *this_01;
  char *in_stack_ffffffffffffff48;
  CVmFile *buf_00;
  CVmFile *in_stack_ffffffffffffff50;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  CVmFile::write_bytes
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
  CVmFile::write_bytes
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40);
  for (local_18 = *(CTcMakeDef **)(in_RDI + 0x70); local_18 != (CTcMakeDef *)0x0;
      local_18 = CTcMakeDef::get_next(local_18)) {
  }
  CVmFile::write_uint2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  for (local_18 = *(CTcMakeDef **)(in_RDI + 0x70); local_18 != (CTcMakeDef *)0x0;
      local_18 = CTcMakeDef::get_next(local_18)) {
    CTcMakeDef::get_sym((CTcMakeDef *)0x20ba90);
    get_strlen((textchar_t *)0x20ba98);
    CVmFile::write_uint2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    CTcMakeDef::get_sym((CTcMakeDef *)0x20babe);
    CTcMakeDef::get_sym((CTcMakeDef *)0x20bad0);
    get_strlen((textchar_t *)0x20bad8);
    CVmFile::write_bytes
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40
              );
    ptVar1 = CTcMakeDef::get_expan((CTcMakeDef *)0x20baf7);
    if (ptVar1 == (textchar_t *)0x0) {
      CVmFile::write_uint2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    }
    else {
      CTcMakeDef::get_expan((CTcMakeDef *)0x20bb17);
      get_strlen((textchar_t *)0x20bb1f);
      CVmFile::write_uint2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      CTcMakeDef::get_expan((CTcMakeDef *)0x20bb45);
      CTcMakeDef::get_expan((CTcMakeDef *)0x20bb57);
      get_strlen((textchar_t *)0x20bb5f);
      CVmFile::write_bytes
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (size_t)in_stack_ffffffffffffff40);
    }
    CTcMakeDef::is_def(local_18);
    CVmFile::write_bytes
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40
              );
  }
  for (local_20 = *(CTcMakePath **)(in_RDI + 0x58); local_20 != (CTcMakePath *)0x0;
      local_20 = CTcMakePath::get_next(local_20)) {
  }
  CVmFile::write_uint2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  for (local_20 = *(CTcMakePath **)(in_RDI + 0x58); local_20 != (CTcMakePath *)0x0;
      local_20 = CTcMakePath::get_next(local_20)) {
    CTcMakePath::get_path((CTcMakePath *)0x20bc6a);
    get_strlen((textchar_t *)0x20bc72);
    CVmFile::write_uint2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    CTcMakePath::get_path((CTcMakePath *)0x20bc98);
    CTcMakePath::get_path((CTcMakePath *)0x20bcaa);
    get_strlen((textchar_t *)0x20bcb2);
    CVmFile::write_bytes
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(size_t)in_stack_ffffffffffffff40
              );
  }
  CTcTokenizer::get_filedesc_count(G_tok);
  local_28 = CTcTokenizer::get_first_filedesc(G_tok);
  if (local_28 != (CTcTokFileDesc *)0x0) {
    local_28 = CTcTokFileDesc::get_next(local_28);
  }
  CVmFile::write_uint2(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  for (; local_28 != (CTcTokFileDesc *)0x0; local_28 = CTcTokFileDesc::get_next(local_28)) {
    this_01 = in_RSI;
    CTcTokFileDesc::get_fname(local_28);
    get_strlen((textchar_t *)0x20bd8a);
    CVmFile::write_uint2(this_01,in_stack_ffffffffffffff3c);
    buf_00 = in_RSI;
    this_00 = (CVmFile *)CTcTokFileDesc::get_fname(local_28);
    CTcTokFileDesc::get_fname(local_28);
    get_strlen((textchar_t *)0x20bdca);
    CVmFile::write_bytes(this_00,(char *)buf_00,(size_t)this_01);
  }
  return;
}

Assistant:

void CTcMake::write_build_config_to_sym_file(CVmFile *fp)
{
    CTcMakeDef *def;
    CTcMakePath *inc;
    CTcTokFileDesc *desc;
    size_t cnt;
    char buf[32];

    /* write the compiler version */
    buf[0] = TC_VSN_MAJOR;
    buf[1] = TC_VSN_MINOR;
    buf[2] = TC_VSN_REV;
    buf[3] = TC_VSN_PATCH;
    buf[4] = TC_VSN_DEVBUILD;
    fp->write_bytes(buf, 5);

    /* write the debug mode */
    buf[0] = (char)debug_;
    fp->write_bytes(buf, 1);

    /* 
     *   Write our list of pre-defined and pre-undefined symbols (-D and
     *   -U options).  If any changes are made to the -D/-U list, we'll
     *   have to rebuild, since these options can change the meaning of
     *   the source code.  
     */

    /* count the symbols in our list */
    for (cnt = 0, def = def_head_ ; def != 0 ;
         def = def->get_next(), ++cnt) ;

    /* write the count */
    fp->write_uint2(cnt);

    /* write each option */
    for (def = def_head_ ; def != 0 ; def = def->get_next())
    {
        /* write the symbol */
        fp->write_uint2(get_strlen(def->get_sym()));
        fp->write_bytes(def->get_sym(), get_strlen(def->get_sym()));

        /* write the expansion */
        if (def->get_expan() != 0)
        {
            fp->write_uint2(get_strlen(def->get_expan()));
            fp->write_bytes(def->get_expan(), get_strlen(def->get_expan()));
        }
        else
            fp->write_uint2(0);

        /* write the define/undefine flag */
        buf[0] = (char)def->is_def();
        fp->write_bytes(buf, 1);
    }
    
    /* 
     *   Write the #include search list.  If the search list changes, the
     *   location in which we find a particular header file could change,
     *   hence the text inserted by a #include directive could change,
     *   hence we'd have to rebuild.  
     */

    /* count the list */
    for (cnt = 0, inc = inc_head_ ; inc != 0 ;
         inc = inc->get_next(), ++cnt) ;

    /* write the count */
    fp->write_uint2(cnt);

    /* write the list */
    for (inc = inc_head_ ; inc != 0 ; inc = inc->get_next())
    {
        /* write the entry */
        fp->write_uint2(get_strlen(inc->get_path()));
        fp->write_bytes(inc->get_path(), get_strlen(inc->get_path()));
    }

    /*
     *   Write the actual list of #include files that were included in the
     *   program.  We'll have to check each of these to see if any of them
     *   have been modified more recently than the symbol file.
     */

    /* get the count */
    cnt = G_tok->get_filedesc_count();

    /* 
     *   start with the second descriptor, because the first is the source
     *   file itself, which isn't part of the include list 
     */
    desc = G_tok->get_first_filedesc();
    if (desc != 0)
    {
        /* skip the first descriptor */
        desc = desc->get_next();

        /* we're not writing it, so don't count it */
        --cnt;
    }

    /* write the count, excluding the actual source file */
    fp->write_uint2(cnt);

    /* write the descriptors */
    for ( ; desc != 0 ; desc = desc->get_next())
    {
        /* 
         *   Write the filename string.  Store the fully resolved local
         *   filename, not the original unresolved name, because we want to
         *   be able to detect a change in the configuration that points us
         *   to a different resolved local file.  
         */
        fp->write_uint2(get_strlen(desc->get_fname()));
        fp->write_bytes(desc->get_fname(), get_strlen(desc->get_fname()));
    }
}